

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_test.cc
# Opt level: O0

void re2::RegexpCaptureNames(void)

{
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  LogMessage local_818;
  key_type local_694 [3];
  undefined1 local_688 [8];
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  want;
  LogMessage local_4d8;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_358;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *have;
  LogMessage local_1d0;
  StringPiece local_40;
  undefined1 local_30 [8];
  RegexpStatus status;
  Regexp *x;
  
  RegexpStatus::RegexpStatus((RegexpStatus *)local_30);
  StringPiece::StringPiece(&local_40,"(?P<g1>a+)|(e)(?P<g2>w*)+(?P<g1>b+)");
  status.tmp_ = (string *)Regexp::Parse(&local_40,PerlX,(RegexpStatus *)local_30);
  bVar2 = RegexpStatus::ok((RegexpStatus *)local_30);
  if (!bVar2) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x43);
    poVar4 = LogMessage::stream(&local_1d0);
    std::operator<<(poVar4,"Check failed: status.ok()");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d0);
  }
  iVar3 = Regexp::NumCaptures((Regexp *)status.tmp_);
  if (iVar3 != 4) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&have,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x44);
    poVar4 = LogMessage::stream((LogMessage *)&have);
    std::operator<<(poVar4,"Check failed: (4) == (x->NumCaptures())");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&have);
  }
  local_358 = Regexp::CaptureNames_abi_cxx11_((Regexp *)status.tmp_);
  if (local_358 ==
      (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_4d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x46);
    poVar4 = LogMessage::stream(&local_4d8);
    std::operator<<(poVar4,"Check failed: have != NULL");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_4d8);
  }
  sVar5 = std::
          map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size(local_358);
  if (sVar5 != 3) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&want._M_t._M_impl.super__Rb_tree_header._M_node_count,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x47);
    poVar4 = LogMessage::stream((LogMessage *)&want._M_t._M_impl.super__Rb_tree_header._M_node_count
                               );
    std::operator<<(poVar4,"Check failed: (3) == (have->size())");
    LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&want._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_688);
  local_694[2] = 1;
  pmVar6 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_688,local_694 + 2);
  std::__cxx11::string::operator=((string *)pmVar6,"g1");
  local_694[1] = 3;
  pmVar6 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_688,local_694 + 1);
  std::__cxx11::string::operator=((string *)pmVar6,"g2");
  local_694[0] = 4;
  pmVar6 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_688,local_694);
  std::__cxx11::string::operator=((string *)pmVar6,"g1");
  bVar2 = std::operator==((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_688,local_358);
  if (!bVar2) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_818,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x4d);
    poVar4 = LogMessage::stream(&local_818);
    std::operator<<(poVar4,"Check failed: (want) == (*have)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_818);
  }
  Regexp::Decref((Regexp *)status.tmp_);
  pmVar1 = local_358;
  if (local_358 !=
      (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)0x0) {
    std::
    map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map(local_358);
    operator_delete(pmVar1);
  }
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_688);
  RegexpStatus::~RegexpStatus((RegexpStatus *)local_30);
  return;
}

Assistant:

TEST(Regexp, CaptureNames) {
  Regexp* x;
  RegexpStatus status;
  x = Regexp::Parse(
      "(?P<g1>a+)|(e)(?P<g2>w*)+(?P<g1>b+)", Regexp::PerlX, &status);
  EXPECT_TRUE(status.ok());
  EXPECT_EQ(4, x->NumCaptures());
  const map<int, string>* have = x->CaptureNames();
  EXPECT_TRUE(have != NULL);
  EXPECT_EQ(3, have->size());
  map<int, string> want;
  want[1] = "g1";
  want[3] = "g2";
  want[4] = "g1";

  EXPECT_EQ(want, *have);
  x->Decref();
  delete have;
}